

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O0

void __thiscall Fl_Tree_Item_Array::enlarge(Fl_Tree_Item_Array *this,int count)

{
  int iVar1;
  Fl_Tree_Item **__dest;
  Fl_Tree_Item **newitems;
  int newsize;
  int newtotal;
  int count_local;
  Fl_Tree_Item_Array *this_local;
  
  iVar1 = this->_total + count;
  if (this->_size <= iVar1) {
    if (this->_chunksize < iVar1 / 0x96) {
      this->_chunksize = this->_chunksize * 10;
    }
    iVar1 = this->_size + this->_chunksize;
    __dest = (Fl_Tree_Item **)malloc((long)iVar1 << 3);
    if (this->_items != (Fl_Tree_Item **)0x0) {
      memmove(__dest,this->_items,(long)this->_size << 3);
      free(this->_items);
      this->_items = (Fl_Tree_Item **)0x0;
    }
    this->_items = __dest;
    this->_size = iVar1;
  }
  return;
}

Assistant:

void Fl_Tree_Item_Array::enlarge(int count) {
  int newtotal = _total + count;	// new total
  if ( newtotal >= _size ) {		// more than we have allocated?
    if ( (newtotal/150) > _chunksize ) _chunksize *= 10;
    // Increase size of array
    int newsize = _size + _chunksize;
    Fl_Tree_Item **newitems = (Fl_Tree_Item**)malloc(newsize * sizeof(Fl_Tree_Item*));
    if ( _items ) { 
      // Copy old array -> new, delete old
      memmove(newitems, _items, _size * sizeof(Fl_Tree_Item*));
      free((void*)_items); _items = 0;
    }
    // Adjust items/sizeitems
    _items = newitems;
    _size = newsize;
  }
}